

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::Container(Container *this,uid_t id,bool permanent)

{
  bool permanent_local;
  uid_t id_local;
  Container *this_local;
  
  ContextManager::ContextManager(&this->super_ContextManager);
  (this->super_ContextManager)._vptr_ContextManager = (_func_int **)&PTR__die_0018a7d8;
  this->id_ = id;
  this->pid_ = 0;
  this->permanent_ = permanent;
  SharedMemoryObject<TaskData>::SharedMemoryObject<>(&this->task_data_);
  SharedBarrier::SharedBarrier(&this->barrier_,2);
  std::filesystem::__cxx11::path::path(&this->root_);
  std::filesystem::__cxx11::path::path(&this->work_dir_);
  this->cpuacct_controller_ = (CgroupController *)0x0;
  this->memory_controller_ = (CgroupController *)0x0;
  this->slave_pid_ = -1;
  (this->run_start_).tv_sec = 0;
  (this->run_start_).tv_usec = 0;
  return;
}

Assistant:

Container::Container(uid_t id, bool permanent) : id_(id), permanent_(permanent) {}